

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

file_info * heap_get_entry(heap_queue *heap)

{
  ulong uVar1;
  ulong uVar2;
  file_info *pfVar3;
  int iVar4;
  file_info *tmp;
  file_info *r;
  int local_38;
  int c;
  int b;
  int a;
  uint64_t c_key;
  uint64_t b_key;
  uint64_t a_key;
  heap_queue *heap_local;
  
  if (heap->used < 1) {
    heap_local = (heap_queue *)0x0;
  }
  else {
    heap_local = (heap_queue *)*heap->files;
    iVar4 = heap->used + -1;
    heap->used = iVar4;
    *heap->files = heap->files[iVar4];
    c = 0;
    uVar1 = (*heap->files)->key;
    while( true ) {
      local_38 = c * 2 + 1;
      if (heap->used <= local_38) break;
      c_key = heap->files[local_38]->key;
      iVar4 = c * 2 + 2;
      if ((iVar4 < heap->used) && (uVar2 = heap->files[iVar4]->key, uVar2 < c_key)) {
        local_38 = iVar4;
        c_key = uVar2;
      }
      if (uVar1 <= c_key) {
        return (file_info *)heap_local;
      }
      pfVar3 = heap->files[c];
      heap->files[c] = heap->files[local_38];
      heap->files[local_38] = pfVar3;
      c = local_38;
    }
  }
  return (file_info *)heap_local;
}

Assistant:

static struct file_info *
heap_get_entry(struct heap_queue *heap)
{
	uint64_t a_key, b_key, c_key;
	int a, b, c;
	struct file_info *r, *tmp;

	if (heap->used < 1)
		return (NULL);

	/*
	 * The first file in the list is the earliest; we'll return this.
	 */
	r = heap->files[0];

	/*
	 * Move the last item in the heap to the root of the tree
	 */
	heap->files[0] = heap->files[--(heap->used)];

	/*
	 * Rebalance the heap.
	 */
	a = 0; /* Starting element and its heap key */
	a_key = heap->files[a]->key;
	for (;;) {
		b = a + a + 1; /* First child */
		if (b >= heap->used)
			return (r);
		b_key = heap->files[b]->key;
		c = b + 1; /* Use second child if it is smaller. */
		if (c < heap->used) {
			c_key = heap->files[c]->key;
			if (c_key < b_key) {
				b = c;
				b_key = c_key;
			}
		}
		if (a_key <= b_key)
			return (r);
		tmp = heap->files[a];
		heap->files[a] = heap->files[b];
		heap->files[b] = tmp;
		a = b;
	}
}